

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

shared_ptr<kratos::Expr> __thiscall kratos::util::mux(util *this,Var *cond,int64_t left,Var *right)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [8];
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Expr> sVar4;
  shared_ptr<kratos::Var> local_58;
  undefined1 local_48 [8];
  shared_ptr<kratos::ConditionalExpr> expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &cond->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &right->super_enable_shared_from_this<kratos::Var>);
  ConditionalExpr::create
            ((ConditionalExpr *)local_48,
             (shared_ptr<kratos::Var> *)
             &expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,left,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  iVar3 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  this_00 = &expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::__shared_ptr<kratos::Expr,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::ConditionalExpr,void>
            ((__shared_ptr<kratos::Expr,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
            ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)(CONCAT44(extraout_var,iVar3) + 400),this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  auVar1 = local_48;
  iVar3 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  peVar2 = expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (((Expr *)auVar1)->super_Var).generator_ = (Generator *)CONCAT44(extraout_var_00,iVar3);
  *(undefined1 (*) [8])this = local_48;
  expr.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(element_type **)(this + 8) = peVar2;
  local_48 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
  sVar4.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Expr>)
         sVar4.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> util::mux(Var &cond, int64_t left, Var &right) {
    auto expr = ConditionalExpr::create(cond.shared_from_this(), left, right.shared_from_this());
    cond.generator()->add_expr(expr);
    expr->set_generator(cond.generator());
    return expr;
}